

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

bool __thiscall SQCompilation::CheckerVisitor::isSafeAccess(CheckerVisitor *this,AccessExpr *acc)

{
  do {
    if (acc->_nullable != false) {
      return true;
    }
    acc = (AccessExpr *)acc->_receiver;
  } while ((acc->super_Expr).super_Node._op - TO_GETFIELD < 4);
  return false;
}

Assistant:

bool CheckerVisitor::isSafeAccess(const AccessExpr *acc) {
  if (acc->isNullable())
    return true;

  const Expr *recevier = acc->receiver();

  if (recevier->isAccessExpr()) {
    return isSafeAccess(recevier->asAccessExpr());
  }

  return false;
}